

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::VertexArrays::VertexBuffersTest::VertexBuffersTest
          (VertexBuffersTest *this,Context *context)

{
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"vertex_arrays_vertex_buffers",
             "Vertex Array Object Vertex Buffer and Buffers Test");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01dd8320;
  this->m_po = 0;
  this->m_vao = 0;
  this->m_bo_array_0 = 0;
  this->m_bo_array_1 = 0;
  this->m_bo_xfb = 0;
  return;
}

Assistant:

VertexBuffersTest::VertexBuffersTest(deqp::Context& context)
	: deqp::TestCase(context, "vertex_arrays_vertex_buffers", "Vertex Array Object Vertex Buffer and Buffers Test")
	, m_po(0)
	, m_vao(0)
	, m_bo_array_0(0)
	, m_bo_array_1(0)
	, m_bo_xfb(0)
{
	/* Intentionally left blank. */
}